

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  secp256k1_fe *b;
  int iVar1;
  size_t size;
  void *prealloc_00;
  secp256k1_context *psVar2;
  long lVar3;
  undefined1 *data;
  uint flags_00;
  secp256k1_fe_storage *r;
  bool bVar4;
  secp256k1_ge local_348;
  secp256k1_fe dx_over_dz_squared;
  uchar out [32];
  secp256k1_fe local_290;
  secp256k1_fe local_268;
  int local_240;
  secp256k1_gej d;
  secp256k1_fe local_1b8;
  secp256k1_fe zi2;
  secp256k1_fe zr;
  secp256k1_fe zi;
  secp256k1_ge d_ge;
  secp256k1_gej local_b8;
  
  d.x.n[0] = 0xbb67ae856a09e667;
  d.x.n[1] = 0xa54ff53a3c6ef372;
  d.x.n[2] = 0x9b05688c510e527f;
  d.x.n[3] = 0x5be0cd191f83d9ab;
  d.z.n[2] = 0;
  secp256k1_sha256_write
            ((secp256k1_sha256 *)&d,
             (uchar *)"For this sample, this 63-byte string will be used as input data",0x3f);
  secp256k1_sha256_finalize((secp256k1_sha256 *)&d,out);
  data = secp256k1_selftest_sha256_output32;
  iVar1 = bcmp(out,secp256k1_selftest_sha256_output32,0x20);
  if (iVar1 == 0) {
    secp256k1_context_preallocated_size(flags);
    *(secp256k1_callback *)((long)prealloc + 0xb0) = default_illegal_callback;
    *(secp256k1_callback *)((long)prealloc + 0xc0) = default_error_callback;
    if ((char)flags == '\x01') {
      *(undefined1 (*) [16])prealloc = (undefined1  [16])0x0;
      if ((flags >> 9 & 1) != 0) {
        *(secp256k1_ge_storage (**) [16])((long)prealloc + 8) = secp256k1_ecmult_static_context;
        secp256k1_ecmult_gen_blind
                  ((secp256k1_ecmult_gen_context *)((long)prealloc + 8),(uchar *)0x0);
      }
      if (((flags >> 8 & 1) != 0) && (*prealloc == 0)) {
        r = (secp256k1_fe_storage *)((long)prealloc + 0xe0);
        local_b8.infinity = 0;
        local_b8.x.n[0] = 0x2815b16f81798;
        local_b8.x.n[1] = 0xdb2dce28d959f;
        local_b8.x.n[2] = 0xe870b07029bfc;
        local_b8.x.n[3] = 0xbbac55a06295c;
        local_b8.x.n[4] = 0x79be667ef9dc;
        local_b8.y.n[0] = 0x7d08ffb10d4b8;
        local_b8.y.n[1] = 0x48a68554199c4;
        local_b8.y.n[2] = 0xe1108a8fd17b4;
        local_b8.y.n[3] = 0xc4655da4fbfc0;
        local_b8.y.n[4] = 0x483ada7726a3;
        local_b8.z.n[0] = 1;
        local_b8.z.n[1] = 0;
        local_b8.z.n[2] = 0;
        local_b8.z.n[3] = 0;
        local_b8.z.n[4] = 0;
        *(secp256k1_fe_storage **)prealloc = r;
        secp256k1_gej_double_var(&d,&local_b8,(secp256k1_fe *)0x0);
        d_ge.x.n[4] = d.x.n[4];
        d_ge.x.n[2] = d.x.n[2];
        d_ge.x.n[3] = d.x.n[3];
        d_ge.x.n[0] = d.x.n[0];
        d_ge.x.n[1] = d.x.n[1];
        d_ge.y.n[0] = d.y.n[0];
        d_ge.y.n[1] = d.y.n[1];
        d_ge.y.n[2] = d.y.n[2];
        d_ge.y.n[3] = d.y.n[3];
        d_ge.y.n[4] = d.y.n[4];
        d_ge.infinity = 0;
        secp256k1_ge_set_gej_zinv(&local_348,&local_b8,&d.z);
        out[0x10] = (undefined1)local_348.x.n[2];
        out[0x11] = local_348.x.n[2]._1_1_;
        out[0x12] = local_348.x.n[2]._2_1_;
        out[0x13] = local_348.x.n[2]._3_1_;
        out[0x14] = local_348.x.n[2]._4_1_;
        out[0x15] = local_348.x.n[2]._5_1_;
        out[0x16] = local_348.x.n[2]._6_1_;
        out[0x17] = local_348.x.n[2]._7_1_;
        out[0x18] = (undefined1)local_348.x.n[3];
        out[0x19] = local_348.x.n[3]._1_1_;
        out[0x1a] = local_348.x.n[3]._2_1_;
        out[0x1b] = local_348.x.n[3]._3_1_;
        out[0x1c] = local_348.x.n[3]._4_1_;
        out[0x1d] = local_348.x.n[3]._5_1_;
        out[0x1e] = local_348.x.n[3]._6_1_;
        out[0x1f] = local_348.x.n[3]._7_1_;
        out[0] = (undefined1)local_348.x.n[0];
        out[1] = local_348.x.n[0]._1_1_;
        out[2] = local_348.x.n[0]._2_1_;
        out[3] = local_348.x.n[0]._3_1_;
        out[4] = local_348.x.n[0]._4_1_;
        out[5] = local_348.x.n[0]._5_1_;
        out[6] = local_348.x.n[0]._6_1_;
        out[7] = local_348.x.n[0]._7_1_;
        out[8] = (undefined1)local_348.x.n[1];
        out[9] = local_348.x.n[1]._1_1_;
        out[10] = local_348.x.n[1]._2_1_;
        out[0xb] = local_348.x.n[1]._3_1_;
        out[0xc] = local_348.x.n[1]._4_1_;
        out[0xd] = local_348.x.n[1]._5_1_;
        out[0xe] = local_348.x.n[1]._6_1_;
        out[0xf] = local_348.x.n[1]._7_1_;
        local_290.n[0] = local_348.y.n[0];
        local_290.n[1] = local_348.y.n[1];
        local_290.n[2] = local_348.y.n[2];
        local_290.n[3] = local_348.y.n[3];
        local_290.n[4] = local_348.y.n[4];
        local_268.n[0] = local_b8.z.n[0];
        local_268.n[1] = local_b8.z.n[1];
        local_268.n[2] = local_b8.z.n[2];
        local_268.n[3] = local_b8.z.n[3];
        local_268.n[4] = local_b8.z.n[4];
        local_240 = 0;
        lVar3 = 0x1fff;
        while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
          secp256k1_fe_normalize_var(&local_290);
          secp256k1_fe_to_storage(r + 1,&local_290);
          secp256k1_gej_add_ge_var((secp256k1_gej *)out,(secp256k1_gej *)out,&d_ge,&zr);
          secp256k1_fe_normalize_var(&zr);
          secp256k1_fe_to_storage(r,&zr);
          r = r + 2;
        }
        b = &d.z;
        secp256k1_fe_mul(&zi,&local_268,b);
        secp256k1_fe_inv(&zi,&zi);
        secp256k1_ge_set_gej_zinv(&local_348,(secp256k1_gej *)out,&zi);
        secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)prealloc + 0x800a0),&local_348);
        secp256k1_fe_mul(b,&zi,&local_268);
        secp256k1_fe_sqr(&dx_over_dz_squared,b);
        secp256k1_fe_mul(&dx_over_dz_squared,&dx_over_dz_squared,&d.x);
        for (lVar3 = 0x80060; lVar3 != 0xa0; lVar3 = lVar3 + -0x40) {
          secp256k1_ge_from_storage(&local_348,(secp256k1_ge_storage *)((long)prealloc + lVar3));
          secp256k1_fe_mul(&zi,&zi,&local_348.x);
          secp256k1_fe_sqr(&zi2,&zi);
          secp256k1_fe_mul(&local_1b8,&zi2,&zi);
          secp256k1_fe_mul(&local_348.x,&local_348.x,&zi2);
          local_348.x.n[0] = (dx_over_dz_squared.n[0] - local_348.x.n[0]) + 0x3ffffbfffff0bc;
          local_348.x.n[1] = (dx_over_dz_squared.n[1] - local_348.x.n[1]) + 0x3ffffffffffffc;
          local_348.x.n[2] = (dx_over_dz_squared.n[2] - local_348.x.n[2]) + 0x3ffffffffffffc;
          local_348.x.n[3] = (dx_over_dz_squared.n[3] - local_348.x.n[3]) + 0x3ffffffffffffc;
          local_348.x.n[4] = (dx_over_dz_squared.n[4] - local_348.x.n[4]) + 0x3fffffffffffc;
          secp256k1_fe_mul(&local_348.y,&local_348.y,&local_1b8);
          secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)prealloc + lVar3),&local_348);
        }
      }
      *(uint *)((long)prealloc + 0xd0) = flags >> 10 & 1;
      return (secp256k1_context *)prealloc;
    }
    secp256k1_default_illegal_callback_fn("Invalid flags",data);
  }
  flags_00 = 0x10e45e;
  secp256k1_default_error_callback_fn("self test failed",data);
  size = secp256k1_context_preallocated_size(flags_00);
  prealloc_00 = checked_malloc(&default_error_callback,size);
  psVar2 = secp256k1_context_preallocated_create(prealloc_00,flags_00);
  return psVar2;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    void* const base = prealloc;
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }
    VERIFY_CHECK(prealloc != NULL);
    prealloc_size = secp256k1_context_preallocated_size(flags);
    ret = (secp256k1_context*)manual_alloc(&prealloc, sizeof(secp256k1_context), base, prealloc_size);
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&ret->illegal_callback,
                                    "Invalid flags");
            return NULL;
    }

    secp256k1_ecmult_context_init(&ret->ecmult_ctx);
    secp256k1_ecmult_gen_context_init(&ret->ecmult_gen_ctx);

    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx, &prealloc);
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        secp256k1_ecmult_context_build(&ret->ecmult_ctx, &prealloc);
    }
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return (secp256k1_context*) ret;
}